

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ptrdiff_t CLI::detail::find_member
                    (string *name,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *names,bool ignore_case,bool ignore_underscore)

{
  bool bVar1;
  byte in_CL;
  byte in_DL;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RSI;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDI;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe38;
  difference_type dVar2;
  string *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe88;
  string local_150 [32];
  string local_130 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string local_f0 [32];
  string local_d0 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (in_stack_fffffffffffffe38);
  if ((local_11 & 1) == 0) {
    if ((local_12 & 1) == 0) {
      ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffffe38);
      ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffffe38);
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ::std::
                 find<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                           (in_RSI,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    }
    else {
      in_stack_fffffffffffffe40 = local_150;
      ::std::__cxx11::string::string(in_stack_fffffffffffffe40,(string *)in_RDI._M_current);
      remove_underscore(in_stack_fffffffffffffe88);
      ::std::__cxx11::string::operator=((string *)in_RDI._M_current,local_130);
      ::std::__cxx11::string::~string(local_130);
      ::std::__cxx11::string::~string(local_150);
      ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffffe38);
      ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_fffffffffffffe38);
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ::std::
                 find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_3_>
                           (in_stack_fffffffffffffe68,in_RDI,in_RSI._M_current);
    }
  }
  else if ((local_12 & 1) == 0) {
    ::std::__cxx11::string::string(local_f0,(string *)in_RDI._M_current);
    to_lower(in_stack_fffffffffffffe78);
    ::std::__cxx11::string::operator=((string *)in_RDI._M_current,local_d0);
    ::std::__cxx11::string::~string(local_d0);
    ::std::__cxx11::string::~string(local_f0);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (in_stack_fffffffffffffe38);
    local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (in_stack_fffffffffffffe38);
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_2_>
                         (in_stack_fffffffffffffe68,in_RDI,in_RSI._M_current);
    local_20 = local_f8;
  }
  else {
    ::std::__cxx11::string::string(local_80,(string *)in_RDI._M_current);
    remove_underscore(in_stack_fffffffffffffe88);
    to_lower(in_stack_fffffffffffffe78);
    ::std::__cxx11::string::operator=((string *)in_RDI._M_current,local_40);
    ::std::__cxx11::string::~string(local_40);
    ::std::__cxx11::string::~string(local_60);
    ::std::__cxx11::string::~string(local_80);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (in_stack_fffffffffffffe38);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (in_stack_fffffffffffffe38);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::detail::find_member(std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,bool,bool)::_lambda(std::__cxx11::string)_1_>
                         (in_stack_fffffffffffffe68,in_RDI,in_RSI._M_current);
    local_20 = local_98;
  }
  ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffe38);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe40,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffffe38);
  if (bVar1) {
    ::std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffe38);
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe38);
  }
  else {
    dVar2 = -1;
  }
  return dVar2;
}

Assistant:

CLI11_INLINE std::ptrdiff_t
find_member(std::string name, const std::vector<std::string> names, bool ignore_case, bool ignore_underscore) {
    auto it = std::end(names);
    if(ignore_case) {
        if(ignore_underscore) {
            name = detail::to_lower(detail::remove_underscore(name));
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(detail::remove_underscore(local_name)) == name;
            });
        } else {
            name = detail::to_lower(name);
            it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
                return detail::to_lower(local_name) == name;
            });
        }

    } else if(ignore_underscore) {
        name = detail::remove_underscore(name);
        it = std::find_if(std::begin(names), std::end(names), [&name](std::string local_name) {
            return detail::remove_underscore(local_name) == name;
        });
    } else {
        it = std::find(std::begin(names), std::end(names), name);
    }

    return (it != std::end(names)) ? (it - std::begin(names)) : (-1);
}